

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall SimpleLogger::LoggerStream::put(LoggerStream *this)

{
  uint uVar1;
  SimpleLogger *this_00;
  char *source_file;
  char *func_name;
  size_t line_number;
  undefined8 uVar2;
  long in_RDI;
  string *psVar3;
  string local_28 [40];
  
  if (*(long *)(in_RDI + 0x200) != 0) {
    this_00 = *(SimpleLogger **)(in_RDI + 0x200);
    uVar1 = *(uint *)(in_RDI + 0x1f8);
    source_file = *(char **)(in_RDI + 0x208);
    func_name = *(char **)(in_RDI + 0x210);
    line_number = *(size_t *)(in_RDI + 0x218);
    psVar3 = local_28;
    std::__cxx11::stringstream::str();
    uVar2 = std::__cxx11::string::c_str();
    SimpleLogger::put(this_00,(int)(ulong)uVar1,source_file,func_name,line_number,"%s",uVar2,psVar3)
    ;
    std::__cxx11::string::~string(local_28);
  }
  return;
}

Assistant:

inline void put() {
            if (logger) {
                logger->put( level, file, func, line,
                             "%s", sStream.str().c_str() );
            }
        }